

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

void luaT_callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3,int hasres)

{
  ushort uVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  StkId pTVar4;
  long lVar5;
  
  lVar5 = (long)p3 - (long)L->stack;
  pTVar2 = L->top;
  pGVar3 = (f->value_).gc;
  (pTVar2->value_).gc = pGVar3;
  uVar1 = f->tt_;
  pTVar2->tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
      ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                  ,0x81,
                  "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                 );
  }
  pGVar3 = (p1->value_).gc;
  pTVar2[1].value_.gc = pGVar3;
  uVar1 = p1->tt_;
  pTVar2[1].tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
      ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                  ,0x82,
                  "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                 );
  }
  pGVar3 = (p2->value_).gc;
  pTVar2[2].value_.gc = pGVar3;
  uVar1 = p2->tt_;
  pTVar2[2].tt_ = uVar1;
  if (((short)uVar1 < 0) &&
     (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
      ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                  ,0x83,
                  "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                 );
  }
  pTVar4 = L->top;
  L->top = pTVar4 + 3;
  if (hasres == 0) {
    L->top = pTVar4 + 4;
    pGVar3 = (p3->value_).gc;
    pTVar4[3].value_.gc = pGVar3;
    uVar1 = p3->tt_;
    pTVar4[3].tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x86,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
  }
  if ((L->ci->callstatus & 2) == 0) {
    luaD_callnoyield(L,pTVar2,hasres);
  }
  else {
    luaD_call(L,pTVar2,hasres);
  }
  if (hasres != 0) {
    pTVar2 = L->top;
    pTVar4 = L->stack;
    L->top = pTVar2 + -1;
    pGVar3 = pTVar2[-1].value_.gc;
    *(GCObject **)((long)pTVar4 + lVar5) = pGVar3;
    uVar1 = pTVar2[-1].tt_;
    *(ushort *)((long)pTVar4 + lVar5 + 8) = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x8e,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
  }
  return;
}

Assistant:

void luaT_callTM (lua_State *L, const TValue *f, const TValue *p1,
                  const TValue *p2, TValue *p3, int hasres) {
  ptrdiff_t result = savestack(L, p3);
  StkId func = L->top;
  setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
  setobj2s(L, func + 1, p1);  /* 1st argument */
  setobj2s(L, func + 2, p2);  /* 2nd argument */
  L->top += 3;
  if (!hasres)  /* no result? 'p3' is third argument */
    setobj2s(L, L->top++, p3);  /* 3rd argument */
  /* metamethod may yield only when called from Lua code */
  if (isLua(L->ci))
    luaD_call(L, func, hasres);
  else
    luaD_callnoyield(L, func, hasres);
  if (hasres) {  /* if has result, move it to its place */
    p3 = restorestack(L, result);
    setobjs2s(L, p3, --L->top);
  }
}